

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrSenseDataProviderTypeBD value)

{
  bool bVar1;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  allocator local_d1;
  string vuid;
  string error_str;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_BD_spatial_sensing"), bVar1))
  {
    if (value == XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD) {
      if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
        return true;
      }
      bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_BD_spatial_mesh");
      if (bVar1) {
        return true;
      }
      std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD\"",&local_d1
                );
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_90,objects_info);
      CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_90,&error_str);
      this = &local_90;
    }
    else if (value == XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD) {
      if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
        return true;
      }
      bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_BD_spatial_scene");
      if (bVar1) {
        return true;
      }
      std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD\"",
                 &local_d1);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_78,objects_info);
      CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_78,&error_str);
      this = &local_78;
    }
    else {
      if (value != XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD) {
        return false;
      }
      if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
        return true;
      }
      bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_BD_spatial_anchor");
      if (bVar1) {
        return true;
      }
      std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD\"",
                 &local_d1);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_60,objects_info);
      CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_60,&error_str);
      this = &local_60;
    }
  }
  else {
    std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::string
              ((string *)&error_str,"XrSenseDataProviderTypeBD requires extension ",&local_d1);
    std::__cxx11::string::append((char *)&error_str);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_48,objects_info);
    CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_48,&error_str);
    this = &local_48;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&error_str);
  std::__cxx11::string::~string((string *)&vuid);
  return false;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrSenseDataProviderTypeBD value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_BD_spatial_sensing, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_sensing")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrSenseDataProviderTypeBD requires extension ";
        error_str += " \"XR_BD_spatial_sensing\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD:
            // Enum value XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD requires extension XR_BD_spatial_anchor, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_anchor")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_BD_spatial_anchor\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD:
            // Enum value XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD requires extension XR_BD_spatial_scene, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_scene")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_BD_spatial_scene\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD:
            // Enum value XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD requires extension XR_BD_spatial_mesh, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_mesh")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_BD_spatial_mesh\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}